

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::checkRemoveAcceleratorInfo(CLIntercept *this,cl_accelerator_intel accelerator)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  _Base_ptr platform;
  int iVar2;
  cl_int cVar3;
  iterator __position;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  cl_uint refCount;
  undefined1 local_50 [32];
  
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar6 = std::__throw_system_error(iVar2);
    if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  p_Var7 = (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 == (_Base_ptr)0x0) goto LAB_0017b527;
  p_Var1 = &(this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header;
  __position._M_node = &p_Var1->_M_header;
  do {
    if (*(cl_accelerator_intel *)(p_Var7 + 1) >= accelerator) {
      __position._M_node = p_Var7;
    }
    p_Var7 = (&p_Var7->_M_left)[*(cl_accelerator_intel *)(p_Var7 + 1) < accelerator];
  } while (p_Var7 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
     (accelerator < *(cl_accelerator_intel *)(__position._M_node + 1))) goto LAB_0017b527;
  platform = __position._M_node[1]._M_parent;
  p_Var8 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_0017b427:
    local_50._0_8_ = (key_type)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_50);
  }
  else {
    do {
      if (*(_Base_ptr *)(p_Var8 + 1) >= platform) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(_Base_ptr *)(p_Var8 + 1) < platform];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) || (platform < *(_Base_ptr *)(p_Var5 + 1)))
    goto LAB_0017b427;
    pmVar4 = (mapped_type *)&p_Var5[1]._M_parent;
  }
  if (pmVar4->clGetAcceleratorInfoINTEL ==
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"clGetAcceleratorInfoINTEL","");
    getExtensionFunctionAddress(this,(cl_platform_id)platform,(string *)local_50);
    if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  p_Var8 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_0017b4d2:
    local_50._0_8_ = (key_type)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_50);
  }
  else {
    do {
      if (*(_Base_ptr *)(p_Var8 + 1) >= platform) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(_Base_ptr *)(p_Var8 + 1) < platform];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
       (platform < (_Base_ptr)((_Rb_tree_header *)p_Var5)->_M_node_count)) goto LAB_0017b4d2;
    pmVar4 = (mapped_type *)((long)p_Var5 + 0x28);
  }
  if (pmVar4->clGetAcceleratorInfoINTEL !=
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
    cVar3 = (*pmVar4->clGetAcceleratorInfoINTEL)(accelerator,0x4091,4,local_50,(size_t *)0x0);
    if ((cVar3 == 0) && (local_50._0_4_ == 1)) {
      std::
      _Rb_tree<_cl_accelerator_intel*,std::pair<_cl_accelerator_intel*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>,std::less<_cl_accelerator_intel*>,std::allocator<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>>
      ::erase_abi_cxx11_((_Rb_tree<_cl_accelerator_intel*,std::pair<_cl_accelerator_intel*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>,std::less<_cl_accelerator_intel*>,std::allocator<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>>
                          *)&this->m_AcceleratorInfoMap,__position);
    }
  }
LAB_0017b527:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveAcceleratorInfo(
    cl_accelerator_intel accelerator )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CAcceleratorInfoMap::iterator iter = m_AcceleratorInfoMap.find( accelerator );
    if( iter != m_AcceleratorInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetAcceleratorInfoINTEL == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetAcceleratorInfoINTEL" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetAcceleratorInfoINTEL )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;

            errorCode = dispatchX.clGetAcceleratorInfoINTEL(
                accelerator,
                CL_ACCELERATOR_REFERENCE_COUNT_INTEL,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_AcceleratorInfoMap.erase( iter );
            }
        }
    }
}